

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_accum_param(vector_t ***out,vector_t ***in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
                       uint32 *veclen)

{
  uint uVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n_mgau != 0) {
    uVar6 = 0;
    do {
      if (n_feat != 0) {
        uVar4 = 0;
        do {
          if (n_density != 0) {
            uVar1 = veclen[uVar4];
            uVar7 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                pfVar2 = in[uVar6][uVar4][uVar7];
                pfVar3 = out[uVar6][uVar4][uVar7];
                uVar5 = 0;
                do {
                  pfVar3[uVar5] = pfVar2[uVar5] + pfVar3[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar1 != uVar5);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != n_density);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != n_feat);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_accum_param(vector_t ***out,
		   vector_t ***in,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    out[i][j][k][l] += in[i][j][k][l];
		}
	    }
	}
    }
}